

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O3

int run_test_udp_open_twice(void)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  undefined8 uVar5;
  ulong uVar6;
  long *plVar7;
  int64_t eval_b;
  int64_t eval_a;
  uv_udp_t client;
  long lStack_608;
  long lStack_600;
  undefined1 auStack_5f8 [16];
  undefined1 auStack_5e6 [18];
  undefined8 uStack_5d4;
  undefined8 uStack_5cc;
  undefined8 uStack_5c4;
  undefined8 uStack_5bc;
  undefined8 uStack_5b4;
  undefined8 uStack_5ac;
  undefined8 uStack_5a4;
  undefined8 uStack_59c;
  undefined8 uStack_594;
  undefined4 uStack_58c;
  undefined4 uStack_588;
  undefined4 uStack_584;
  undefined8 uStack_580;
  undefined8 auStack_578 [23];
  long alStack_4c0 [41];
  ulong uStack_378;
  code *pcStack_370;
  long lStack_368;
  long lStack_360;
  undefined1 auStack_358 [16];
  sockaddr sStack_348;
  long alStack_338 [23];
  long alStack_280 [8];
  long lStack_240;
  code *pcStack_1c8;
  long lStack_1b8;
  long lStack_1b0;
  sockaddr sStack_1a8;
  long alStack_198 [23];
  code *pcStack_e0;
  long local_d8;
  long local_d0;
  undefined1 local_c8 [184];
  
  pcStack_e0 = (code *)0x1df706;
  uVar1 = create_udp_socket();
  pcStack_e0 = (code *)0x1df70d;
  uVar2 = create_udp_socket();
  uVar6 = (ulong)uVar2;
  pcStack_e0 = (code *)0x1df714;
  uVar5 = uv_default_loop();
  pcStack_e0 = (code *)0x1df721;
  iVar3 = uv_udp_init(uVar5,local_c8);
  local_d0 = (long)iVar3;
  local_d8 = 0;
  if (local_d0 == 0) {
    pcStack_e0 = (code *)0x1df74b;
    iVar3 = uv_udp_open(local_c8,uVar1);
    local_d0 = (long)iVar3;
    local_d8 = 0;
    if (local_d0 != 0) goto LAB_001df83b;
    pcStack_e0 = (code *)0x1df775;
    iVar3 = uv_udp_open(local_c8,uVar2);
    local_d0 = (long)iVar3;
    local_d8 = -0x10;
    if (local_d0 != -0x10) goto LAB_001df848;
    pcStack_e0 = (code *)0x1df79a;
    iVar3 = close(uVar2);
    local_d0 = (long)iVar3;
    local_d8 = 0;
    if (local_d0 != 0) goto LAB_001df855;
    pcStack_e0 = (code *)0x1df7c4;
    uv_close(local_c8,0);
    pcStack_e0 = (code *)0x1df7c9;
    uVar5 = uv_default_loop();
    pcStack_e0 = (code *)0x1df7d3;
    uv_run(uVar5,0);
    pcStack_e0 = (code *)0x1df7d8;
    uVar6 = uv_default_loop();
    pcStack_e0 = (code *)0x1df7ec;
    uv_walk(uVar6,close_walk_cb,0);
    pcStack_e0 = (code *)0x1df7f6;
    uv_run(uVar6,0);
    local_d0 = 0;
    pcStack_e0 = (code *)0x1df804;
    uVar5 = uv_default_loop();
    pcStack_e0 = (code *)0x1df80c;
    iVar3 = uv_loop_close(uVar5);
    local_d8 = (long)iVar3;
    if (local_d0 == local_d8) {
      pcStack_e0 = (code *)0x1df822;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_e0 = (code *)0x1df83b;
    run_test_udp_open_twice_cold_1();
LAB_001df83b:
    pcStack_e0 = (code *)0x1df848;
    run_test_udp_open_twice_cold_2();
LAB_001df848:
    pcStack_e0 = (code *)0x1df855;
    run_test_udp_open_twice_cold_3();
LAB_001df855:
    pcStack_e0 = (code *)0x1df862;
    run_test_udp_open_twice_cold_4();
  }
  pcStack_e0 = run_test_udp_open_bound;
  run_test_udp_open_twice_cold_5();
  pcStack_1c8 = (code *)0x1df88d;
  pcStack_e0 = (code *)uVar6;
  iVar3 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_1a8);
  alStack_198[0] = (long)iVar3;
  lStack_1b8 = 0;
  if (alStack_198[0] == 0) {
    pcStack_1c8 = (code *)0x1df8b2;
    uVar2 = create_udp_socket();
    uVar6 = (ulong)uVar2;
    pcStack_1c8 = (code *)0x1df8c5;
    iVar3 = bind(uVar2,&sStack_1a8,0x10);
    alStack_198[0] = (long)iVar3;
    lStack_1b8 = 0;
    if (alStack_198[0] != 0) goto LAB_001dfa01;
    pcStack_1c8 = (code *)0x1df8ea;
    uVar5 = uv_default_loop();
    pcStack_1c8 = (code *)0x1df8f7;
    iVar3 = uv_udp_init(uVar5,alStack_198);
    lStack_1b8 = (long)iVar3;
    lStack_1b0 = 0;
    if (lStack_1b8 != 0) goto LAB_001dfa10;
    pcStack_1c8 = (code *)0x1df923;
    iVar3 = uv_udp_open(alStack_198,uVar2);
    lStack_1b8 = (long)iVar3;
    lStack_1b0 = 0;
    if (lStack_1b8 != 0) goto LAB_001dfa1f;
    pcStack_1c8 = (code *)0x1df95b;
    iVar3 = uv_udp_recv_start(alStack_198,alloc_cb,recv_cb);
    lStack_1b8 = (long)iVar3;
    lStack_1b0 = 0;
    if (lStack_1b8 != 0) goto LAB_001dfa2e;
    pcStack_1c8 = (code *)0x1df987;
    uv_close(alStack_198,0);
    pcStack_1c8 = (code *)0x1df98c;
    uVar5 = uv_default_loop();
    pcStack_1c8 = (code *)0x1df996;
    uv_run(uVar5,0);
    pcStack_1c8 = (code *)0x1df99b;
    uVar6 = uv_default_loop();
    pcStack_1c8 = (code *)0x1df9af;
    uv_walk(uVar6,close_walk_cb,0);
    pcStack_1c8 = (code *)0x1df9b9;
    uv_run(uVar6,0);
    lStack_1b8 = 0;
    pcStack_1c8 = (code *)0x1df9c7;
    uVar5 = uv_default_loop();
    pcStack_1c8 = (code *)0x1df9cf;
    iVar3 = uv_loop_close(uVar5);
    lStack_1b0 = (long)iVar3;
    if (lStack_1b8 == lStack_1b0) {
      pcStack_1c8 = (code *)0x1df9e7;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_1c8 = (code *)0x1dfa01;
    run_test_udp_open_bound_cold_1();
LAB_001dfa01:
    pcStack_1c8 = (code *)0x1dfa10;
    run_test_udp_open_bound_cold_2();
LAB_001dfa10:
    pcStack_1c8 = (code *)0x1dfa1f;
    run_test_udp_open_bound_cold_3();
LAB_001dfa1f:
    pcStack_1c8 = (code *)0x1dfa2e;
    run_test_udp_open_bound_cold_4();
LAB_001dfa2e:
    pcStack_1c8 = (code *)0x1dfa3d;
    run_test_udp_open_bound_cold_5();
  }
  pcStack_1c8 = run_test_udp_open_connect;
  run_test_udp_open_bound_cold_6();
  pcStack_370 = (code *)0x1dfa65;
  pcStack_1c8 = (code *)uVar6;
  auStack_358 = uv_buf_init("PING",4);
  pcStack_370 = (code *)0x1dfa85;
  iVar3 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_348);
  alStack_280[0] = (long)iVar3;
  alStack_338[0] = 0;
  if (alStack_280[0] == 0) {
    pcStack_370 = (code *)0x1dfab0;
    uVar2 = create_udp_socket();
    uVar6 = (ulong)uVar2;
    pcStack_370 = (code *)0x1dfab7;
    uVar5 = uv_default_loop();
    pcStack_370 = (code *)0x1dfac7;
    iVar3 = uv_udp_init(uVar5,alStack_280);
    alStack_338[0] = (long)iVar3;
    lStack_368 = 0;
    if (alStack_338[0] != 0) goto LAB_001dfd05;
    pcStack_370 = (code *)0x1dfaf6;
    iVar3 = connect(uVar2,&sStack_348,0x10);
    alStack_338[0] = (long)iVar3;
    lStack_368 = 0;
    if (alStack_338[0] != 0) goto LAB_001dfd12;
    pcStack_370 = (code *)0x1dfb23;
    iVar3 = uv_udp_open(alStack_280,uVar2);
    alStack_338[0] = (long)iVar3;
    lStack_368 = 0;
    if (alStack_338[0] != 0) goto LAB_001dfd1f;
    pcStack_370 = (code *)0x1dfb46;
    uVar5 = uv_default_loop();
    pcStack_370 = (code *)0x1dfb53;
    iVar3 = uv_udp_init(uVar5,alStack_338);
    lStack_368 = (long)iVar3;
    lStack_360 = 0;
    if (lStack_368 != 0) goto LAB_001dfd2c;
    pcStack_370 = (code *)0x1dfb82;
    iVar3 = uv_udp_bind(alStack_338,&sStack_348,0);
    lStack_368 = (long)iVar3;
    lStack_360 = 0;
    if (lStack_368 != 0) goto LAB_001dfd39;
    pcStack_370 = (code *)0x1dfbb8;
    iVar3 = uv_udp_recv_start(alStack_338,alloc_cb,recv_cb);
    lStack_368 = (long)iVar3;
    lStack_360 = 0;
    if (lStack_368 != 0) goto LAB_001dfd46;
    pcStack_370 = (code *)0x1dfbfe;
    iVar3 = uv_udp_send(&send_req,alStack_280,auStack_358,1,0,send_cb);
    lStack_368 = (long)iVar3;
    lStack_360 = 0;
    if (lStack_368 != 0) goto LAB_001dfd53;
    pcStack_370 = (code *)0x1dfc21;
    uVar5 = uv_default_loop();
    pcStack_370 = (code *)0x1dfc2b;
    uv_run(uVar5,0);
    lStack_368 = 1;
    lStack_360 = (long)send_cb_called;
    if (lStack_360 != 1) goto LAB_001dfd60;
    lStack_368 = 2;
    lStack_360 = (long)close_cb_called;
    if (lStack_360 != 2) goto LAB_001dfd6d;
    lStack_368 = lStack_240;
    lStack_360 = 0;
    if (lStack_240 != 0) goto LAB_001dfd7a;
    pcStack_370 = (code *)0x1dfc9a;
    uVar6 = uv_default_loop();
    pcStack_370 = (code *)0x1dfcae;
    uv_walk(uVar6,close_walk_cb,0);
    pcStack_370 = (code *)0x1dfcb8;
    uv_run(uVar6,0);
    lStack_368 = 0;
    pcStack_370 = (code *)0x1dfcc5;
    uVar5 = uv_default_loop();
    pcStack_370 = (code *)0x1dfccd;
    iVar3 = uv_loop_close(uVar5);
    lStack_360 = (long)iVar3;
    if (lStack_368 == lStack_360) {
      pcStack_370 = (code *)0x1dfce8;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_370 = (code *)0x1dfd05;
    run_test_udp_open_connect_cold_1();
LAB_001dfd05:
    pcStack_370 = (code *)0x1dfd12;
    run_test_udp_open_connect_cold_2();
LAB_001dfd12:
    pcStack_370 = (code *)0x1dfd1f;
    run_test_udp_open_connect_cold_3();
LAB_001dfd1f:
    pcStack_370 = (code *)0x1dfd2c;
    run_test_udp_open_connect_cold_4();
LAB_001dfd2c:
    pcStack_370 = (code *)0x1dfd39;
    run_test_udp_open_connect_cold_5();
LAB_001dfd39:
    pcStack_370 = (code *)0x1dfd46;
    run_test_udp_open_connect_cold_6();
LAB_001dfd46:
    pcStack_370 = (code *)0x1dfd53;
    run_test_udp_open_connect_cold_7();
LAB_001dfd53:
    pcStack_370 = (code *)0x1dfd60;
    run_test_udp_open_connect_cold_8();
LAB_001dfd60:
    pcStack_370 = (code *)0x1dfd6d;
    run_test_udp_open_connect_cold_9();
LAB_001dfd6d:
    pcStack_370 = (code *)0x1dfd7a;
    run_test_udp_open_connect_cold_10();
LAB_001dfd7a:
    pcStack_370 = (code *)0x1dfd87;
    run_test_udp_open_connect_cold_11();
  }
  pcStack_370 = run_test_udp_send_unix;
  run_test_udp_open_connect_cold_12();
  uStack_378 = uVar6;
  pcStack_370 = (code *)(ulong)uVar1;
  auStack_5f8 = uv_buf_init("PING",4);
  uVar5 = uv_default_loop();
  uStack_5cc = 0;
  uStack_5c4 = 0;
  uStack_5bc = 0;
  uStack_5b4 = 0;
  uStack_5ac = 0;
  uStack_5a4 = 0;
  uStack_59c = 0;
  uStack_594 = 0;
  uStack_58c = 0;
  uStack_588 = 0;
  uStack_584 = 0;
  uStack_580 = 0;
  auStack_5e6._0_2_ = 1;
  alStack_4c0[0] = 0x11;
  auStack_578[0] = 0x6c;
  auStack_5e6[2] = '/';
  auStack_5e6[3] = 't';
  auStack_5e6[4] = 'm';
  auStack_5e6[5] = 'p';
  auStack_5e6[6] = '/';
  auStack_5e6[7] = 'u';
  auStack_5e6[8] = 'v';
  auStack_5e6[9] = '-';
  auStack_5e6[10] = 't';
  auStack_5e6[0xb] = 'e';
  auStack_5e6[0xc] = 's';
  auStack_5e6[0xd] = 't';
  auStack_5e6[0xe] = '-';
  auStack_5e6[0xf] = 's';
  auStack_5e6[0x10] = 'o';
  auStack_5e6[0x11] = 'c';
  uStack_5d4 = 0x6b;
  iVar3 = socket(1,1,0);
  alStack_4c0[0] = (long)iVar3;
  auStack_578[0] = 0;
  if (alStack_4c0[0] < 0) {
    auStack_578[0] = 0;
    run_test_udp_send_unix_cold_8();
LAB_001e0050:
    run_test_udp_send_unix_cold_2();
LAB_001e0065:
    run_test_udp_send_unix_cold_3();
LAB_001e007a:
    run_test_udp_send_unix_cold_4();
LAB_001e008c:
    run_test_udp_send_unix_cold_5();
  }
  else {
    unlink("/tmp/uv-test-sock");
    iVar4 = bind(iVar3,(sockaddr *)auStack_5e6,0x6e);
    alStack_4c0[0] = (long)iVar4;
    auStack_578[0] = 0;
    if (alStack_4c0[0] != 0) goto LAB_001e0050;
    iVar4 = listen(iVar3,1);
    alStack_4c0[0] = (long)iVar4;
    auStack_578[0] = 0;
    if (alStack_4c0[0] != 0) goto LAB_001e0065;
    iVar4 = uv_udp_init(uVar5,auStack_578);
    alStack_4c0[0] = (long)iVar4;
    lStack_608 = 0;
    if (alStack_4c0[0] != 0) goto LAB_001e007a;
    iVar4 = uv_udp_open(auStack_578,iVar3);
    alStack_4c0[0] = (long)iVar4;
    lStack_608 = 0;
    if (alStack_4c0[0] != 0) goto LAB_001e008c;
    uv_run(uVar5,0);
    iVar4 = uv_udp_send(alStack_4c0,auStack_578,auStack_5f8,1,auStack_5e6,0);
    lStack_608 = (long)iVar4;
    lStack_600 = 0;
    if (lStack_608 == 0) {
      uv_close(auStack_578,0);
      uv_run(uVar5,0);
      close(iVar3);
      unlink("/tmp/uv-test-sock");
      uv_walk(uVar5,close_walk_cb,0);
      uv_run(uVar5,0);
      lStack_608 = 0;
      iVar3 = uv_loop_close(uVar5);
      lStack_600 = (long)iVar3;
      if (lStack_608 == lStack_600) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001e00ad;
    }
  }
  run_test_udp_send_unix_cold_6();
LAB_001e00ad:
  plVar7 = &lStack_608;
  run_test_udp_send_unix_cold_7();
  if (plVar7 != (long *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX;
  }
  close_cb_cold_1();
  iVar3 = uv_is_closing();
  if (iVar3 == 0) {
    iVar3 = uv_close(plVar7,0);
    return iVar3;
  }
  return iVar3;
}

Assistant:

TEST_IMPL(udp_open_twice) {
  uv_udp_t client;
  uv_os_sock_t sock1, sock2;
  int r;

  startup();
  sock1 = create_udp_socket();
  sock2 = create_udp_socket();

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  r = uv_udp_open(&client, sock1);
  ASSERT_OK(r);

  r = uv_udp_open(&client, sock2);
  ASSERT_EQ(r, UV_EBUSY);
  close_socket(sock2);

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}